

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_4ffb8::SetExpr::_parse(SetExpr *this,Context *con)

{
  int *piVar1;
  Index IVar2;
  int iVar3;
  const_reference cVar4;
  char32_t cVar5;
  ulong uVar6;
  
  if (((con->position).it.buffer != (con->finish).buffer) ||
     (uVar6 = (con->position).it.idx, uVar6 != (con->finish).idx)) {
    cVar5 = pegmatite::Context::symbol(con);
    if ((ulong)(uint)cVar5 <
        (ulong)(this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->mSetExpr,(ulong)(uint)cVar5);
      uVar6 = (con->position).it.idx;
      if (cVar4) {
        (con->position).it.idx = uVar6 + 1;
        piVar1 = &(con->position).col;
        *piVar1 = *piVar1 + 1;
        return true;
      }
    }
    else {
      uVar6 = (con->position).it.idx;
    }
  }
  if ((con->error_pos).it.idx < uVar6) {
    iVar3 = (con->position).col;
    (con->error_pos).line = (con->position).line;
    (con->error_pos).col = iVar3;
    IVar2 = (con->position).it.idx;
    (con->error_pos).it.buffer = (con->position).it.buffer;
    (con->error_pos).it.idx = IVar2;
  }
  return false;
}

Assistant:

bool _parse(Context &con) const
	{
		if (!con.end())
		{
			size_t ch = con.symbol();
			if (ch < mSetExpr.size() && mSetExpr[ch])
			{
				con.next_col();
				return true;
			}
		}
		con.set_error_pos();
		return false;
	}